

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O3

shared_ptr<MyCompiler::Condition> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Condition>(RecursiveDescentParser *this)

{
  istream *piVar1;
  undefined1 auVar2 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  long in_RSI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  shared_ptr<MyCompiler::Expression> sVar6;
  shared_ptr<MyCompiler::Condition> sVar7;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  this->stream = (istream *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MyCompiler::Condition,std::allocator<MyCompiler::Condition>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->currentToken,(Condition **)this,
             (allocator<MyCompiler::Condition> *)local_28);
  if (*(int *)(in_RSI + 0x30) == 0x1f) {
    *(undefined4 *)(this->stream + 4) = 1;
    sVar6 = parse<MyCompiler::Expression>((RecursiveDescentParser *)local_28);
    _Var4 = sVar6.super___shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
    piVar1 = this->stream;
    p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar1 + 0x50);
    *(undefined1 (*) [8])(piVar1 + 0x48) = local_28;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar1 + 0x50) = p_Stack_20;
  }
  else {
    *(undefined4 *)(this->stream + 4) = 0;
    parse<MyCompiler::Expression>((RecursiveDescentParser *)local_28);
    p_Var3 = p_Stack_20;
    auVar2 = local_28;
    piVar1 = this->stream;
    local_28 = (undefined1  [8])0x0;
    p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar1 + 0x50);
    *(undefined1 (*) [8])(piVar1 + 0x48) = auVar2;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar1 + 0x50) = p_Var3;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
      }
    }
    parse<MyCompiler::RelOp>((RecursiveDescentParser *)local_28);
    p_Var3 = p_Stack_20;
    auVar2 = local_28;
    piVar1 = this->stream;
    local_28 = (undefined1  [8])0x0;
    p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar1 + 0x60);
    *(undefined1 (*) [8])(piVar1 + 0x58) = auVar2;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar1 + 0x60) = p_Var3;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
      }
    }
    sVar6 = parse<MyCompiler::Expression>((RecursiveDescentParser *)local_28);
    _Var4 = sVar6.super___shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
    piVar1 = this->stream;
    p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar1 + 0x70);
    *(undefined1 (*) [8])(piVar1 + 0x68) = local_28;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar1 + 0x70) = p_Stack_20;
  }
  p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28 = (undefined1  [8])0x0;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    _Var4._M_pi = extraout_RDX;
    if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
      _Var4._M_pi = extraout_RDX_00;
    }
  }
  sVar7.super___shared_ptr<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar7.super___shared_ptr<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Condition>)
         sVar7.super___shared_ptr<MyCompiler::Condition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Condition> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Condition>();

    if (sym == SymbolType::ODD)
    {
        pResult->caseNum = 1;
        pResult->pExpression1 = parse<Expression>();
    }
    else
    {
        pResult->caseNum = 0;
        pResult->pExpression1 = parse<Expression>();
        pResult->pRelOp = parse<RelOp>();
        pResult->pExpression2 = parse<Expression>();
    }

    return pResult;
}